

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O2

void verify_staleblock_reuse_param_test(void)

{
  FILE *pFVar1;
  fdb_status fVar2;
  sb_decision_t sVar3;
  char *pcVar4;
  ulong uVar5;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_info file_info;
  fdb_config local_530;
  char keybuf [512];
  char bodybuf [512];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  local_530.compaction_threshold = '\0';
  local_530.block_reusing_threshold = 0x41;
  while( true ) {
    system("rm -rf  staleblktest* > errorlog.txt");
    fdb_open(&dbfile,"./staleblktest1",&local_530);
    fdb_kvs_open_default(dbfile,&db,&kvs_config);
    uVar5 = 0xffffffffffffffff;
    while (uVar5 = uVar5 + 1, uVar5 < local_530.num_keeping_headers + 1) {
      builtin_strncpy(keybuf,"key",4);
      fVar2 = fdb_set_kv(db,keybuf,0x200,(void *)0x0,0);
      pFVar1 = _stderr;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcVar4 = fdb_error_msg(fVar2);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x95);
        verify_staleblock_reuse_param_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x95,"void verify_staleblock_reuse_param_test()");
      }
      fVar2 = fdb_commit(dbfile,'\x01');
      pFVar1 = _stderr;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcVar4 = fdb_error_msg(fVar2);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x97);
        verify_staleblock_reuse_param_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x97,"void verify_staleblock_reuse_param_test()");
      }
    }
    uVar5 = 0;
    do {
      builtin_strncpy(keybuf,"key",4);
      sprintf(bodybuf,"body%d",uVar5);
      fVar2 = fdb_set_kv(db,keybuf,0x200,bodybuf,0x200);
      pFVar1 = _stderr;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcVar4 = fdb_error_msg(fVar2);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0xa0);
        verify_staleblock_reuse_param_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0xa0,"void verify_staleblock_reuse_param_test()");
      }
      fVar2 = fdb_get_file_info(dbfile,&file_info);
      pFVar1 = _stderr;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcVar4 = fdb_error_msg(fVar2);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0xa3);
        verify_staleblock_reuse_param_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0xa3,"void verify_staleblock_reuse_param_test()");
      }
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (file_info.file_size < 0x1000000);
    sVar3 = sb_check_block_reusing(db);
    if (local_530.block_reusing_threshold == 0x41) {
      if (sVar3 != SBD_RECLAIM) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0xa9);
        verify_staleblock_reuse_param_test()::__test_pass = 1;
        __assert_fail("sb_decision == SBD_RECLAIM",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0xa9,"void verify_staleblock_reuse_param_test()");
      }
    }
    else if (sVar3 != SBD_NONE) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0xab);
      verify_staleblock_reuse_param_test()::__test_pass = 1;
      __assert_fail("sb_decision == SBD_NONE",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0xab,"void verify_staleblock_reuse_param_test()");
    }
    fVar2 = fdb_close(dbfile);
    pFVar1 = _stderr;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    fdb_shutdown();
    if (local_530.block_reusing_threshold == 0) {
      local_530.block_reusing_threshold = 100;
    }
    else {
      if (local_530.block_reusing_threshold != 0x41) {
        memleak_end();
        pcVar4 = "%s PASSED\n";
        if (verify_staleblock_reuse_param_test()::__test_pass != '\0') {
          pcVar4 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar4,"verify staleblock reuse param test");
        return;
      }
      local_530.block_reusing_threshold = 0;
    }
  }
  pcVar4 = fdb_error_msg(fVar2);
  fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
          ,0xb0);
  verify_staleblock_reuse_param_test()::__test_pass = 1;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0xb0,"void verify_staleblock_reuse_param_test()");
}

Assistant:

void verify_staleblock_reuse_param_test() {
    TEST_INIT();
    memleak_start();

    uint64_t i;
    int r;
    const int kv = 512;
    char keybuf[kv];
    char bodybuf[kv];
    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    sb_decision_t sb_decision;
    fdb_file_info file_info;

    // set block reuse threshold = 65
    fdb_config fconfig = fdb_get_default_config();
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 65;

start_data_loading:
    // remove previous staleblktest files
    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    fdb_open(&dbfile, "./staleblktest1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // create num_keeping_headers+1
    for (i = 0; i < fconfig.num_keeping_headers + 1; i++) {
        sprintf(keybuf, "key");
        status = fdb_set_kv(db, keybuf, kv, NULL, 0);
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        sprintf(keybuf, "key");
        sprintf(bodybuf, "body%d", static_cast<int>(i));
        status = fdb_set_kv(db, keybuf, kv, bodybuf, kv);
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size < SB_MIN_BLOCK_REUSING_FILESIZE);

    // expect block reclaim only for valid threshold value
    sb_decision = sb_check_block_reusing(db);
    if (fconfig.block_reusing_threshold == 65) {
        TEST_CHK(sb_decision == SBD_RECLAIM);
    } else {
        TEST_CHK(sb_decision == SBD_NONE);
    }

    // intermediate cleanup
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    // run again with different config
    if (fconfig.block_reusing_threshold == 65) {
        // disable with 0
        fconfig.block_reusing_threshold = 0;
        goto start_data_loading;
    } else if (fconfig.block_reusing_threshold == 0) {
        // disable with 100
        fconfig.block_reusing_threshold = 100;
        goto start_data_loading;
    }

    memleak_end();
    TEST_RESULT("verify staleblock reuse param test");
}